

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int readDbPage(PgHdr *pPg,u32 iFrame)

{
  u16 uVar1;
  Pgno PVar2;
  uint uVar3;
  Pager *pPVar4;
  sqlite3_file *psVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  
  pPVar4 = pPg->pPager;
  PVar2 = pPg->pgno;
  uVar3 = pPVar4->pageSize;
  if (iFrame == 0) {
    iVar9 = (*pPVar4->fd->pMethods->xRead)
                      (pPVar4->fd,pPg->pData,uVar3,(ulong)(PVar2 - 1) * (long)(int)uVar3);
    iVar8 = 0;
    if (iVar9 != 0x20a) {
      iVar8 = iVar9;
    }
  }
  else {
    psVar5 = pPVar4->pWal->pWalFd;
    uVar1 = (pPVar4->pWal->hdr).szPage;
    uVar10 = CONCAT22(uVar1,uVar1) & 0x1fe00;
    uVar7 = uVar10;
    if ((int)uVar3 <= (int)uVar10) {
      uVar7 = uVar3;
    }
    iVar8 = (*psVar5->pMethods->xRead)
                      (psVar5,pPg->pData,uVar7,(ulong)(uVar10 + 0x18) * (ulong)(iFrame - 1) + 0x38);
  }
  if (PVar2 == 1) {
    if (iVar8 == 0) {
      pvVar6 = pPg->pData;
      uVar11 = *(undefined4 *)((long)pvVar6 + 0x18);
      uVar12 = *(undefined4 *)((long)pvVar6 + 0x1c);
      uVar13 = *(undefined4 *)((long)pvVar6 + 0x20);
      uVar14 = *(undefined4 *)((long)pvVar6 + 0x24);
    }
    else {
      uVar14 = 0xffffffff;
      uVar11 = 0xffffffff;
      uVar12 = 0xffffffff;
      uVar13 = 0xffffffff;
    }
    *(undefined4 *)pPVar4->dbFileVers = uVar11;
    *(undefined4 *)(pPVar4->dbFileVers + 4) = uVar12;
    *(undefined4 *)(pPVar4->dbFileVers + 8) = uVar13;
    *(undefined4 *)(pPVar4->dbFileVers + 0xc) = uVar14;
  }
  return iVar8;
}

Assistant:

static int readDbPage(PgHdr *pPg, u32 iFrame){
  Pager *pPager = pPg->pPager; /* Pager object associated with page pPg */
  Pgno pgno = pPg->pgno;       /* Page number to read */
  int rc = SQLITE_OK;          /* Return code */
  int pgsz = pPager->pageSize; /* Number of bytes to read */

  assert( pPager->eState>=PAGER_READER && !MEMDB );
  assert( isOpen(pPager->fd) );

#ifndef SQLITE_OMIT_WAL
  if( iFrame ){
    /* Try to pull the page from the write-ahead log. */
    rc = sqlite3WalReadFrame(pPager->pWal, iFrame, pgsz, pPg->pData);
  }else
#endif
  {
    i64 iOffset = (pgno-1)*(i64)pPager->pageSize;
    rc = sqlite3OsRead(pPager->fd, pPg->pData, pgsz, iOffset);
    if( rc==SQLITE_IOERR_SHORT_READ ){
      rc = SQLITE_OK;
    }
  }

  if( pgno==1 ){
    if( rc ){
      /* If the read is unsuccessful, set the dbFileVers[] to something
      ** that will never be a valid file version.  dbFileVers[] is a copy
      ** of bytes 24..39 of the database.  Bytes 28..31 should always be
      ** zero or the size of the database in page. Bytes 32..35 and 35..39
      ** should be page numbers which are never 0xffffffff.  So filling
      ** pPager->dbFileVers[] with all 0xff bytes should suffice.
      **
      ** For an encrypted database, the situation is more complex:  bytes
      ** 24..39 of the database are white noise.  But the probability of
      ** white noise equaling 16 bytes of 0xff is vanishingly small so
      ** we should still be ok.
      */
      memset(pPager->dbFileVers, 0xff, sizeof(pPager->dbFileVers));
    }else{
      u8 *dbFileVers = &((u8*)pPg->pData)[24];
      memcpy(&pPager->dbFileVers, dbFileVers, sizeof(pPager->dbFileVers));
    }
  }
  CODEC1(pPager, pPg->pData, pgno, 3, rc = SQLITE_NOMEM_BKPT);

  PAGER_INCR(sqlite3_pager_readdb_count);
  PAGER_INCR(pPager->nRead);
  IOTRACE(("PGIN %p %d\n", pPager, pgno));
  PAGERTRACE(("FETCH %d page %d hash(%08x)\n",
               PAGERID(pPager), pgno, pager_pagehash(pPg)));

  return rc;
}